

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

bool testing::internal::ParseNaturalNumber<int>(string *str,int *number)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  int *piVar4;
  ostream *poVar5;
  bool local_49;
  int result;
  GTestLog local_38;
  bool local_31;
  ulonglong uStack_30;
  bool parse_success;
  BiggestConvertible parsed;
  char *end;
  int *number_local;
  string *str_local;
  
  end = (char *)number;
  number_local = (int *)str;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)number_local);
    bVar1 = IsDigit(*pcVar3);
    if (bVar1) {
      piVar4 = __errno_location();
      *piVar4 = 0;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      uStack_30 = strtoull(pcVar3,(char **)&parsed,10);
      local_49 = false;
      if (*(char *)parsed == '\0') {
        piVar4 = __errno_location();
        local_49 = *piVar4 == 0;
      }
      local_31 = local_49;
      bVar1 = IsTrue(true);
      if (!bVar1) {
        GTestLog::GTestLog(&local_38,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/baishuai[P]leetcode/lib/googletest/googletest/src/gtest-internal-inl.h"
                           ,0x3e5);
        poVar5 = GTestLog::GetStream(&local_38);
        std::operator<<(poVar5,"Condition sizeof(Integer) <= sizeof(parsed) failed. ");
        GTestLog::~GTestLog(&local_38);
      }
      if (((local_31 & 1U) != 0) && ((long)(int)uStack_30 == uStack_30)) {
        *(int *)end = (int)uStack_30;
        return true;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool ParseNaturalNumber(const ::std::string& str, Integer* number) {
  // Fail fast if the given string does not begin with a digit;
  // this bypasses strtoXXX's "optional leading whitespace and plus
  // or minus sign" semantics, which are undesirable here.
  if (str.empty() || !IsDigit(str[0])) {
    return false;
  }
  errno = 0;

  char* end;
  // BiggestConvertible is the largest integer type that system-provided
  // string-to-number conversion routines can return.

# if GTEST_OS_WINDOWS && !defined(__GNUC__)

  // MSVC and C++ Builder define __int64 instead of the standard long long.
  typedef unsigned __int64 BiggestConvertible;
  const BiggestConvertible parsed = _strtoui64(str.c_str(), &end, 10);

# else

  typedef unsigned long long BiggestConvertible;  // NOLINT
  const BiggestConvertible parsed = strtoull(str.c_str(), &end, 10);

# endif  // GTEST_OS_WINDOWS && !defined(__GNUC__)

  const bool parse_success = *end == '\0' && errno == 0;

  // TODO(vladl@google.com): Convert this to compile time assertion when it is
  // available.
  GTEST_CHECK_(sizeof(Integer) <= sizeof(parsed));

  const Integer result = static_cast<Integer>(parsed);
  if (parse_success && static_cast<BiggestConvertible>(result) == parsed) {
    *number = result;
    return true;
  }
  return false;
}